

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

void __thiscall brynet::net::DataSocket::closeSocket(DataSocket *this)

{
  bool bVar1;
  DataSocket *this_local;
  
  bVar1 = std::operator!=(&this->mSocket,(nullptr_t)0x0);
  if (bVar1) {
    this->mCanWrite = false;
    std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::operator=
              (&this->mSocket,(nullptr_t)0x0);
  }
  return;
}

Assistant:

void DataSocket::closeSocket()
{
    if (mSocket != nullptr)
    {
        mCanWrite = false;
        mSocket = nullptr;
    }
}